

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,ConstStringParam printable_name)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *pDVar4;
  MessageOptions *this_00;
  FieldDescriptor *this_01;
  Descriptor *pDVar5;
  FieldDescriptor *extension;
  int i;
  int type_extension_count;
  Descriptor *type;
  FieldDescriptor *result;
  ConstStringParam printable_name_local;
  Descriptor *extendee_local;
  DescriptorPool *this_local;
  
  iVar2 = Descriptor::extension_range_count(extendee);
  if (iVar2 == 0) {
    this_local = (DescriptorPool *)0x0;
  }
  else {
    this_local = (DescriptorPool *)FindExtensionByName(this,printable_name);
    if ((this_local == (DescriptorPool *)0x0) ||
       (pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)this_local), pDVar4 != extendee
       )) {
      this_00 = Descriptor::options(extendee);
      bVar1 = MessageOptions::message_set_wire_format(this_00);
      if ((bVar1) &&
         (pDVar4 = FindMessageTypeByName(this,printable_name), pDVar4 != (Descriptor *)0x0)) {
        iVar2 = Descriptor::extension_count(pDVar4);
        for (extension._0_4_ = 0; (int)extension < iVar2; extension._0_4_ = (int)extension + 1) {
          this_01 = Descriptor::extension(pDVar4,(int)extension);
          pDVar5 = FieldDescriptor::containing_type(this_01);
          if ((((pDVar5 == extendee) &&
               (TVar3 = FieldDescriptor::type(this_01), TVar3 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional(this_01), bVar1)) &&
             (pDVar5 = FieldDescriptor::message_type(this_01), pDVar5 == pDVar4)) {
            return this_01;
          }
        }
      }
      this_local = (DescriptorPool *)0x0;
    }
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, ConstStringParam printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}